

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

_Bool rf_compute_glyph_metrics_from_image
                (rf_image image,rf_color key,int *codepoints,rf_glyph_info *dst,
                rf_int codepoints_and_dst_count)

{
  rf_color rVar1;
  uint uVar2;
  _Bool _Var3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  void *src;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  void *pvVar20;
  
  _Var3 = (_Bool)((0 < codepoints_and_dst_count && dst != (rf_glyph_info *)0x0) &
                 codepoints != (int *)0x0 & image.valid);
  if (_Var3 == true) {
    uVar2 = 0;
    if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
      uVar2 = *(uint *)(&DAT_0017c058 + (ulong)(image.format - RF_UNCOMPRESSED_GRAYSCALE) * 4);
    }
    uVar7 = (ulong)(uint)image.width;
    uVar8 = (ulong)image.height;
    uVar6 = (ulong)uVar2;
    uVar15 = 0;
    uVar16 = 0;
    if (0 < (long)uVar8) {
      uVar5 = 0;
      pvVar20 = image.data;
      do {
        rVar1.r = '\0';
        rVar1.g = '\0';
        rVar1.b = '\0';
        rVar1.a = '\0';
        uVar15 = 0;
        if (0 < image.width) {
          uVar16 = 0;
          src = pvVar20;
          do {
            rVar1 = rf_format_one_pixel_to_rgba32(src,image.format);
            uVar15 = uVar16;
            if (rVar1 != key) break;
            uVar16 = uVar16 + 1;
            src = (void *)((long)src + uVar6);
            uVar15 = uVar7;
          } while (uVar7 != uVar16);
        }
        uVar16 = uVar5;
        if (rVar1 != key) break;
        uVar5 = uVar5 + 1;
        pvVar20 = (void *)((long)pvVar20 + uVar6 * uVar7);
        uVar16 = uVar8;
      } while (uVar5 != uVar8);
    }
    iVar4 = (int)uVar16;
    iVar12 = (int)uVar15;
    iVar17 = (iVar4 + -1) * image.width;
    pvVar20 = (void *)(((long)iVar4 * (long)image.width + (long)iVar12) * uVar6 + (long)image.data);
    iVar13 = -1;
    do {
      rVar1 = rf_format_one_pixel_to_rgba32(pvVar20,image.format);
      iVar17 = iVar17 + image.width;
      iVar13 = iVar13 + 1;
      pvVar20 = (void *)((long)pvVar20 + (long)image.width * uVar6);
    } while (rVar1 != key);
    if (iVar4 < image.height) {
      iVar9 = image.width * iVar4;
      iVar10 = 0;
      uVar16 = uVar16 & 0xffffffff;
      lVar11 = 0;
      do {
        if (iVar12 < image.width) {
          lVar11 = (long)(int)lVar11;
          uVar7 = uVar15 & 0xffffffff;
          do {
            iVar18 = (int)uVar7;
            rVar1 = rf_format_one_pixel_to_rgba32
                              ((void *)((long)(int)(((int)uVar16 * image.width + iVar18) * uVar2) +
                                       (long)image.data),image.format);
            if (rVar1 == key) break;
            pvVar20 = (void *)(((long)iVar18 + (long)iVar9) * uVar6 + (long)image.data);
            iVar14 = -1;
            do {
              rVar1 = rf_format_one_pixel_to_rgba32(pvVar20,image.format);
              iVar14 = iVar14 + 1;
              pvVar20 = (void *)((long)pvVar20 + uVar6);
            } while (rVar1 != key);
            dst[lVar11].codepoint = codepoints[lVar11];
            dst[lVar11].field_0.rec.x = (float)iVar18;
            dst[lVar11].field_0.rec.y = (float)(int)uVar16;
            dst[lVar11].field_0.rec.width = (float)iVar14;
            dst[lVar11].field_0.rec.height = (float)iVar13;
            dst[lVar11].offset_x = 0;
            dst[lVar11].offset_y = 0;
            dst[lVar11].advance_x = 0;
            lVar11 = lVar11 + 1;
            uVar19 = iVar18 + iVar12 + iVar14;
            uVar7 = (ulong)uVar19;
          } while ((int)uVar19 < image.width);
        }
        iVar10 = iVar10 + 1;
        uVar19 = iVar10 * (iVar4 + iVar13) + iVar4;
        uVar16 = (ulong)uVar19;
      } while (((int)uVar19 < image.height) &&
              (iVar9 = iVar9 + iVar17, (int)lVar11 < codepoints_and_dst_count));
    }
  }
  return _Var3;
}

Assistant:

RF_API bool rf_compute_glyph_metrics_from_image(rf_image image, rf_color key, const int* codepoints, rf_glyph_info* dst, rf_int codepoints_and_dst_count)
{
    bool result = false;

    if (image.valid && codepoints && dst && codepoints_and_dst_count > 0)
    {
        const int bpp = rf_bytes_per_pixel(image.format);
        const int image_data_size = rf_image_size(image);

        // This macro uses `bpp` and returns the pixel from the image at the index provided by calling rf_format_one_pixel_to_rgba32.
        #define RF_GET_PIXEL(index) rf_format_one_pixel_to_rgba32((char*)image.data + ((index) * bpp), image.format)

        // Parse image data to get char_spacing and line_spacing
        int char_spacing = 0;
        int line_spacing = 0;
        {
            int x = 0;
            int y = 0;
            for (y = 0; y < image.height; y++)
            {
                rf_color pixel = {0};
                for (x = 0; x < image.width; x++)
                {
                    pixel = RF_GET_PIXEL(y * image.width + x);
                    if (!rf_color_match(pixel, key)) break;
                }

                if (!rf_color_match(pixel, key)) break;
            }
            char_spacing = x;
            line_spacing = y;
        }

        // Compute char height
        int char_height = 0;
        {
            while (!rf_color_match(RF_GET_PIXEL((line_spacing + char_height) * image.width + char_spacing), key))
            {
                char_height++;
            }
        }

        // Check array values to get characters: value, x, y, w, h
        int index         = 0;
        int line_to_read  = 0;
        int x_pos_to_read = char_spacing;

        // Parse image data to get rectangle sizes
        while ((line_spacing + line_to_read * (char_height + line_spacing)) < image.height && index < codepoints_and_dst_count)
        {
            while (x_pos_to_read < image.width && !rf_color_match(RF_GET_PIXEL((line_spacing + (char_height + line_spacing) * line_to_read) * image.width + x_pos_to_read), key))
            {
                int char_width = 0;
                while (!rf_color_match(RF_GET_PIXEL(((line_spacing + (char_height + line_spacing) * line_to_read) * image.width + x_pos_to_read + char_width)), key)) {
                    char_width++;
                }

                dst[index].codepoint = codepoints[index];
                dst[index].x         = (float) x_pos_to_read;
                dst[index].y         = (float) (line_spacing + line_to_read * (char_height + line_spacing));
                dst[index].width     = (float) char_width;
                dst[index].height    = (float) char_height;

                // On image based fonts (XNA style), character offsets and x_advance are not required (set to 0)
                dst[index].offset_x  = 0;
                dst[index].offset_y  = 0;
                dst[index].advance_x = 0;

                index++;

                x_pos_to_read += (char_width + char_spacing);
            }

            line_to_read++;
            x_pos_to_read = char_spacing;
        }

        result = true;

        #undef RF_GET_PIXEL
    }

    return result;
}